

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O0

void Ivy_GraphUpdateNetwork
               (Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int fUpdateLevel,int nGain)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *p_00;
  Ivy_Obj_t *pIVar3;
  int local_40;
  int Required;
  int nNodesOld;
  int nNodesNew;
  Ivy_Obj_t *pRootNew;
  int nGain_local;
  int fUpdateLevel_local;
  Dec_Graph_t *pGraph_local;
  Ivy_Obj_t *pRoot_local;
  Ivy_Man_t *p_local;
  
  if (fUpdateLevel == 0) {
    local_40 = 1000000;
  }
  else {
    local_40 = Vec_IntEntry(p->vRequired,pRoot->Id);
  }
  iVar1 = Ivy_ManNodeNum(p);
  p_00 = Ivy_GraphToNetwork(p,pGraph);
  pIVar3 = Ivy_Regular(p_00);
  if ((int)(*(uint *)&pIVar3->field_0x8 >> 0xb) <= local_40) {
    Ivy_ObjReplace(p,pRoot,p_00,1,0,1);
    iVar2 = Ivy_ManNodeNum(p);
    if (nGain <= iVar1 - iVar2) {
      Ivy_ManPropagateBuffers(p,1);
      return;
    }
    __assert_fail("nGain <= nNodesOld - nNodesNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                  ,0x21f,
                  "void Ivy_GraphUpdateNetwork(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int, int)");
  }
  __assert_fail("(int)Ivy_Regular(pRootNew)->Level <= Required",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                ,0x20e,
                "void Ivy_GraphUpdateNetwork(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int, int)");
}

Assistant:

void Ivy_GraphUpdateNetwork( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain )
{
    Ivy_Obj_t * pRootNew;
    int nNodesNew, nNodesOld, Required;
    Required = fUpdateLevel? Vec_IntEntry( p->vRequired, pRoot->Id ) : 1000000;
    nNodesOld = Ivy_ManNodeNum(p);
    // create the new structure of nodes
    pRootNew = Ivy_GraphToNetwork( p, pGraph );
    assert( (int)Ivy_Regular(pRootNew)->Level <= Required );
//    if ( Ivy_Regular(pRootNew)->Level == Required )
//        printf( "Difference %d.\n", Ivy_Regular(pRootNew)->Level - Required );
    // remove the old nodes
//    Ivy_AigReplace( pMan->pManFunc, pRoot, pRootNew, fUpdateLevel );
/*
    if ( Ivy_IsComplement(pRootNew) )
        printf( "c" );
    else
        printf( "d" );
    if ( Ivy_ObjRefs(Ivy_Regular(pRootNew)) > 0 )
        printf( "%d", Ivy_ObjRefs(Ivy_Regular(pRootNew)) );
    printf( " " );
*/
    Ivy_ObjReplace( p, pRoot, pRootNew, 1, 0, 1 );
    // compare the gains
    nNodesNew = Ivy_ManNodeNum(p);
    assert( nGain <= nNodesOld - nNodesNew );
    // propagate the buffer
    Ivy_ManPropagateBuffers( p, 1 );
}